

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cc
# Opt level: O0

ostream * pstack::operator<<(ostream *os,JSON<std::shared_ptr<pstack::Dwarf::Unit>,_char> *unit)

{
  bool bVar1;
  element_type *peVar2;
  JObject *pJVar3;
  unique_ptr<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_> *puVar4;
  type v;
  ostream *poVar5;
  char local_89;
  Macros *local_88;
  Macros *macros;
  DIE local_78;
  char local_4f [3];
  uint local_4c;
  char local_45;
  uint local_44;
  char local_3d [20];
  char local_29;
  undefined1 local_28 [8];
  JObject fmt;
  JSON<std::shared_ptr<pstack::Dwarf::Unit>,_char> *unit_local;
  ostream *os_local;
  
  fmt.sep = (char *)unit;
  JObject::JObject((JObject *)local_28,os);
  peVar2 = std::__shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(*(__shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        **)fmt.sep);
  local_29 = '\0';
  pJVar3 = JObject::field<char[7],unsigned_int,char>
                     ((JObject *)local_28,(char (*) [7])0x2a8675,&peVar2->length,&local_29);
  peVar2 = std::__shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(*(__shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        **)fmt.sep);
  local_3d[0] = '\0';
  pJVar3 = JObject::field<char[7],unsigned_long,char>
                     (pJVar3,(char (*) [7])0x2a84cd,&peVar2->offset,local_3d);
  peVar2 = std::__shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(*(__shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        **)fmt.sep);
  local_44 = (uint)peVar2->version;
  local_45 = '\0';
  pJVar3 = JObject::field<char[8],int,char>
                     (pJVar3,(char (*) [8])0x2a871f,(int *)&local_44,&local_45);
  peVar2 = std::__shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(*(__shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        **)fmt.sep);
  local_4c = (uint)peVar2->addrlen;
  local_4f[2] = 0;
  pJVar3 = JObject::field<char[8],int,char>
                     (pJVar3,(char (*) [8])"addrlen",(int *)&local_4c,local_4f + 2);
  peVar2 = std::__shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(*(__shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        **)fmt.sep);
  local_4f[1] = 0;
  pJVar3 = JObject::field<char[3],std::array<unsigned_char,8ul>,char>
                     (pJVar3,(char (*) [3])0x2a8435,&peVar2->id,local_4f + 1);
  peVar2 = std::__shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(*(__shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        **)fmt.sep);
  local_4f[0] = '\0';
  pJVar3 = JObject::field<char[9],pstack::Dwarf::UnitType,char>
                     (pJVar3,(char (*) [9])"unitType",&peVar2->unitType,local_4f);
  peVar2 = std::__shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(*(__shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        **)fmt.sep);
  Dwarf::Unit::root(&local_78,peVar2);
  macros._7_1_ = 0;
  JObject::field<char[8],pstack::Dwarf::DIE,char>
            (pJVar3,(char (*) [8])"dietree",&local_78,(char *)((long)&macros + 7));
  Dwarf::DIE::~DIE(&local_78);
  peVar2 = std::__shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(*(__shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        **)fmt.sep);
  puVar4 = Dwarf::Unit::getLines(peVar2);
  bVar1 = std::operator==(puVar4,(nullptr_t)0x0);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    peVar2 = std::__shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(*(__shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            **)fmt.sep);
    puVar4 = Dwarf::Unit::getLines(peVar2);
    v = std::unique_ptr<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_>::
        operator*(puVar4);
    macros._6_1_ = 0;
    JObject::field<char[12],pstack::Dwarf::LineInfo,char>
              ((JObject *)local_28,(char (*) [12])"linenumbers",v,(char *)((long)&macros + 6));
  }
  peVar2 = std::__shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(*(__shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        **)fmt.sep);
  local_88 = Dwarf::Unit::getMacros(peVar2);
  if (local_88 != (Macros *)0x0) {
    local_89 = '\0';
    JObject::field<char[7],pstack::Dwarf::Macros,char>
              ((JObject *)local_28,(char (*) [7])0x2a801d,local_88,&local_89);
  }
  peVar2 = std::__shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(*(__shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        **)fmt.sep);
  Dwarf::Unit::purge(peVar2);
  poVar5 = JObject::operator_cast_to_ostream_((JObject *)local_28);
  JObject::~JObject((JObject *)local_28);
  return poVar5;
}

Assistant:

std::ostream &operator << (std::ostream &os, const JSON<Dwarf::Unit::sptr> &unit) {
    JObject fmt(os);

    fmt.field("length", unit.object->length)
        .field("offset",  unit.object->offset)
        .field("version", int(unit.object->version))
        .field("addrlen", int(unit.object->addrlen))
        .field("id", unit.object->id)
        .field("unitType", unit.object->unitType)
        .field("dietree", unit.object->root());
    if (unit.object->getLines() != nullptr)
        fmt.field("linenumbers", *unit.object->getLines());

    auto macros = unit.object->getMacros();
    if (macros)
        fmt.field("macros", *macros);
    unit.object->purge();
    return fmt;
}